

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator.c
# Opt level: O0

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  sunrealtype w;
  sunrealtype v;
  sunrealtype u;
  sunrealtype ep;
  sunrealtype b;
  sunrealtype a;
  sunrealtype *rdata;
  void *user_data_local;
  N_Vector ydot_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  dVar1 = *(double *)((long)user_data + 8);
  dVar2 = *(double *)((long)user_data + 0x10);
  dVar3 = **(double **)((long)y->content + 0x10);
  dVar4 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  dVar5 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  **(double **)((long)ydot->content + 0x10) =
       dVar4 * dVar3 * dVar3 + -(dVar5 + 1.0) * dVar3 + *user_data;
  *(double *)(*(long *)((long)ydot->content + 0x10) + 8) = dVar5 * dVar3 + -(dVar4 * dVar3 * dVar3);
  *(double *)(*(long *)((long)ydot->content + 0x10) + 0x10) =
       -dVar5 * dVar3 + (dVar1 - dVar5) / dVar2;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype a  = rdata[0];                    /* access data entries */
  sunrealtype b  = rdata[1];
  sunrealtype ep = rdata[2];
  sunrealtype u  = NV_Ith_S(y, 0); /* access solution values */
  sunrealtype v  = NV_Ith_S(y, 1);
  sunrealtype w  = NV_Ith_S(y, 2);

  /* fill in the RHS function */
  NV_Ith_S(ydot, 0) = a - (w + 1.0) * u + v * u * u;
  NV_Ith_S(ydot, 1) = w * u - v * u * u;
  NV_Ith_S(ydot, 2) = (b - w) / ep - w * u;

  return 0; /* Return with success */
}